

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

ImU32 igColorConvertFloat4ToU32(ImVec4 in)

{
  ImU32 IVar1;
  undefined1 local_18 [8];
  ImVec4 in_local;
  
  in_local._0_8_ = in._8_8_;
  local_18 = in._0_8_;
  IVar1 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_18);
  return IVar1;
}

Assistant:

CIMGUI_API ImU32 *_igColorConvertFloat4ToU32 (ImVec4 const *larg1) {
  ImU32 * lresult = (ImU32 *)0 ;
  ImVec4 arg1 ;
  ImU32 result;
  
  arg1 = *larg1;
  try {
    result = igColorConvertFloat4ToU32(arg1);
    lresult = new ImU32(result);
    return lresult;
  } catch (...) {
    return (ImU32 *)0;
  }
}